

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppFullscreen(bool *p_open)

{
  bool bVar1;
  bool local_41;
  ImVec2 *local_40;
  ImVec2 *local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiViewport *local_18;
  ImGuiViewport *viewport;
  bool *p_open_local;
  
  viewport = (ImGuiViewport *)p_open;
  local_18 = ImGui::GetMainViewport();
  if ((ShowExampleAppFullscreen::use_work_area & 1U) == 0) {
    local_30 = &local_18->Pos;
  }
  else {
    local_30 = &local_18->WorkPos;
  }
  ImVec2::ImVec2(&local_20,0.0,0.0);
  ImGui::SetNextWindowPos(local_30,0,&local_20);
  if ((ShowExampleAppFullscreen::use_work_area & 1U) == 0) {
    local_40 = &local_18->Size;
  }
  else {
    local_40 = &local_18->WorkSize;
  }
  ImGui::SetNextWindowSize(local_40,0);
  bVar1 = ImGui::Begin("Example: Fullscreen window",(bool *)viewport,ShowExampleAppFullscreen::flags
                      );
  if (bVar1) {
    ImGui::Checkbox("Use work area instead of main area",&ShowExampleAppFullscreen::use_work_area);
    ImGui::SameLine(0.0,-1.0);
    HelpMarker(
              "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
              );
    ImGui::CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen::flags,0x80);
    ImGui::CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen::flags,0x2b);
    ImGui::Indent(0.0);
    ImGui::CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen::flags,1);
    ImGui::CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen::flags,0x20);
    ImGui::CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen::flags,8);
    ImGui::Unindent(0.0);
    local_41 = false;
    if (viewport != (ImGuiViewport *)0x0) {
      ImVec2::ImVec2(&local_28,0.0,0.0);
      local_41 = ImGui::Button("Close this window",&local_28);
    }
    if (local_41 != false) {
      *(undefined1 *)&viewport->Flags = 0;
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppFullscreen(bool* p_open)
{
    static bool use_work_area = true;
    static ImGuiWindowFlags flags = ImGuiWindowFlags_NoDecoration | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoSavedSettings;

    // We demonstrate using the full viewport area or the work area (without menu-bars, task-bars etc.)
    // Based on your use case you may want one of the other.
    const ImGuiViewport* viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(use_work_area ? viewport->WorkPos : viewport->Pos);
    ImGui::SetNextWindowSize(use_work_area ? viewport->WorkSize : viewport->Size);

    if (ImGui::Begin("Example: Fullscreen window", p_open, flags))
    {
        ImGui::Checkbox("Use work area instead of main area", &use_work_area);
        ImGui::SameLine();
        HelpMarker("Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference.");

        ImGui::CheckboxFlags("ImGuiWindowFlags_NoBackground", &flags, ImGuiWindowFlags_NoBackground);
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoDecoration", &flags, ImGuiWindowFlags_NoDecoration);
        ImGui::Indent();
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoTitleBar", &flags, ImGuiWindowFlags_NoTitleBar);
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoCollapse", &flags, ImGuiWindowFlags_NoCollapse);
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoScrollbar", &flags, ImGuiWindowFlags_NoScrollbar);
        ImGui::Unindent();

        if (p_open && ImGui::Button("Close this window"))
            *p_open = false;
    }
    ImGui::End();
}